

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelLengthCase::iterate(LabelLengthCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_17e8;
  string local_1668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1648;
  GetNameFunc local_1628;
  int local_1620;
  GetNameFunc local_1618;
  int local_1610;
  string local_1608;
  allocator<char> local_15e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  int local_155c;
  undefined1 local_1558 [4];
  deUint32 err_7;
  GetNameFunc local_13d8;
  int local_13d0;
  GetNameFunc local_13c8;
  int local_13c0;
  string local_13b8;
  allocator<char> local_1391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  int local_130c;
  undefined1 local_1308 [4];
  deUint32 err_6;
  MessageBuilder local_1188;
  string local_1008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  GetNameFunc local_fc8;
  int local_fc0;
  GetNameFunc local_fb8;
  int local_fb0;
  string local_fa8;
  allocator<char> local_f81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  int local_efc;
  undefined1 local_ef8 [4];
  deUint32 err_5;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  ScopedLogSection local_d28;
  ScopedLogSection section_1;
  string local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  GetNameFunc local_b60;
  int local_b58;
  GetNameFunc local_b50;
  int local_b48;
  string local_b40;
  allocator<char> local_b19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  int local_a94;
  undefined1 local_a90 [4];
  deUint32 err_4;
  GetNameFunc local_910;
  int local_908;
  GetNameFunc local_900;
  int local_8f8;
  string local_8f0;
  allocator<char> local_8c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  int local_844;
  undefined1 local_840 [4];
  deUint32 err_3;
  MessageBuilder local_6c0;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  GetNameFunc local_500;
  int local_4f8;
  GetNameFunc local_4f0;
  int local_4e8;
  string local_4e0;
  allocator<char> local_4b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  int local_434;
  undefined1 local_430 [4];
  deUint32 err_2;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  ScopedLogSection local_260;
  ScopedLogSection section;
  TestLog *local_248;
  int local_240;
  string local_238;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int local_18c;
  GetNameFunc p_Stack_188;
  deUint32 err_1;
  int local_180;
  GetNameFunc local_178;
  int local_170;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  int local_bc;
  undefined8 uStack_b8;
  deUint32 err;
  GLsync sync;
  GLuint shader;
  int outlen;
  char *msg;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  Functions *gl;
  LabelLengthCase *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    bVar1 = isKHRDebugSupported((this->super_TestCase).m_context);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," // ERROR: ",(allocator<char> *)((long)&msg + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msg + 7));
      _shader = "This is a debug label";
      sync._4_4_ = 0xffffffff;
      uStack_b8 = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_bc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_bc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"Got Error ",&local_141);
          EVar7 = glu::getErrorStr(local_bc);
          p_Stack_188 = EVar7.m_getName;
          local_180 = EVar7.m_value;
          local_178 = p_Stack_188;
          local_170 = local_180;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_168,&local_178);
          std::operator+(&local_120,&local_140,&local_168);
          std::operator+(&local_100,&local_120,": ");
          std::operator+(&local_e0,&local_100,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator(&local_141);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      sync._0_4_ = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_18c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_18c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"Got Error ",&local_211);
          EVar7 = glu::getErrorStr(local_18c);
          section.m_log = (TestLog *)EVar7.m_getName;
          local_240 = EVar7.m_value;
          local_248 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_238,&local_248);
          std::operator+(&local_1f0,&local_210,&local_238);
          std::operator+(&local_1d0,&local_1f0,": ");
          std::operator+(&local_1b0,&local_1d0,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator(&local_211);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Shader",&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"Shader object",&local_2a9);
      tcu::ScopedLogSection::ScopedLogSection(&local_260,pTVar5,&local_280,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_430,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_430,(char (*) [22])"Querying label length");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_430);
      sync._4_4_ = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))(0x82e1,sync._0_4_,0,(long)&sync + 4,0);
      do {
        local_434 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_434 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b8,"Got Error ",&local_4b9);
          EVar7 = glu::getErrorStr(local_434);
          local_500 = EVar7.m_getName;
          local_4f8 = EVar7.m_value;
          local_4f0 = local_500;
          local_4e8 = local_4f8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4e0,&local_4f0);
          std::operator+(&local_498,&local_4b8,&local_4e0);
          std::operator+(&local_478,&local_498,": ");
          std::operator+(&local_458,&local_478,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::allocator<char>::~allocator(&local_4b9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_6c0,(char (*) [24])"Query returned length: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&sync + 4));
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6c0);
      }
      else {
        de::toString<int>(&local_540,(int *)((long)&sync + 4));
        std::operator+(&local_520,"\'length\' was not 0, got ",&local_540);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)&local_540);
      }
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_840,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_840,(char (*) [27])"Setting label to string: \"");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_840);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                (0x82e1,sync._0_4_,0xffffffff,"This is a debug label");
      do {
        local_844 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_844 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8c8,"Got Error ",&local_8c9);
          EVar7 = glu::getErrorStr(local_844);
          local_910 = EVar7.m_getName;
          local_908 = EVar7.m_value;
          local_900 = local_910;
          local_8f8 = local_908;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_8f0,&local_900);
          std::operator+(&local_8a8,&local_8c8,&local_8f0);
          std::operator+(&local_888,&local_8a8,": ");
          std::operator+(&local_868,&local_888,"objectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_868);
          std::__cxx11::string::~string((string *)&local_868);
          std::__cxx11::string::~string((string *)&local_888);
          std::__cxx11::string::~string((string *)&local_8a8);
          std::__cxx11::string::~string((string *)&local_8f0);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::allocator<char>::~allocator(&local_8c9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_a90,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_a90,(char (*) [22])"Querying label length");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_a90);
      sync._4_4_ = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))(0x82e1,sync._0_4_,0,(long)&sync + 4,0);
      do {
        local_a94 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_a94 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b18,"Got Error ",&local_b19);
          EVar7 = glu::getErrorStr(local_a94);
          local_b60 = EVar7.m_getName;
          local_b58 = EVar7.m_value;
          local_b50 = local_b60;
          local_b48 = local_b58;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b40,&local_b50);
          std::operator+(&local_af8,&local_b18,&local_b40);
          std::operator+(&local_ad8,&local_af8,": ");
          std::operator+(&local_ab8,&local_ad8,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_ab8);
          std::__cxx11::string::~string((string *)&local_ab8);
          std::__cxx11::string::~string((string *)&local_ad8);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_b40);
          std::__cxx11::string::~string((string *)&local_b18);
          std::allocator<char>::~allocator(&local_b19);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0x15) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&section_1,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&section_1,(char (*) [24])"Query returned length: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&sync + 4));
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
      }
      else {
        de::toString<int>(&local_ba0,(int *)((long)&sync + 4));
        std::operator+(&local_b80,"\'length\' was not 21, got ",&local_ba0);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_b80);
        std::__cxx11::string::~string((string *)&local_b80);
        std::__cxx11::string::~string((string *)&local_ba0);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_260);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"Sync",&local_d49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d70,"Sync object",&local_d71);
      tcu::ScopedLogSection::ScopedLogSection(&local_d28,pTVar5,&local_d48,&local_d70);
      std::__cxx11::string::~string((string *)&local_d70);
      std::allocator<char>::~allocator(&local_d71);
      std::__cxx11::string::~string((string *)&local_d48);
      std::allocator<char>::~allocator(&local_d49);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_ef8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_ef8,(char (*) [22])"Querying label length");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_ef8);
      sync._4_4_ = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))(uStack_b8,0,(long)&sync + 4,0);
      do {
        local_efc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_efc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f80,"Got Error ",&local_f81);
          EVar7 = glu::getErrorStr(local_efc);
          local_fc8 = EVar7.m_getName;
          local_fc0 = EVar7.m_value;
          local_fb8 = local_fc8;
          local_fb0 = local_fc0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_fa8,&local_fb8);
          std::operator+(&local_f60,&local_f80,&local_fa8);
          std::operator+(&local_f40,&local_f60,": ");
          std::operator+(&local_f20,&local_f40,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_f20);
          std::__cxx11::string::~string((string *)&local_f20);
          std::__cxx11::string::~string((string *)&local_f40);
          std::__cxx11::string::~string((string *)&local_f60);
          std::__cxx11::string::~string((string *)&local_fa8);
          std::__cxx11::string::~string((string *)&local_f80);
          std::allocator<char>::~allocator(&local_f81);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1188,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1188,(char (*) [24])"Query returned length: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&sync + 4));
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1188);
      }
      else {
        de::toString<int>(&local_1008,(int *)((long)&sync + 4));
        std::operator+(&local_fe8,"\'length\' was not 0, got ",&local_1008);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_fe8);
        std::__cxx11::string::~string((string *)&local_fe8);
        std::__cxx11::string::~string((string *)&local_1008);
      }
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1308,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1308,(char (*) [27])"Setting label to string: \"")
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1308);
      (**(code **)(result.m_message.field_2._8_8_ + 0xfc8))
                (uStack_b8,0xffffffff,"This is a debug label");
      do {
        local_130c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_130c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1390,"Got Error ",&local_1391);
          EVar7 = glu::getErrorStr(local_130c);
          local_13d8 = EVar7.m_getName;
          local_13d0 = EVar7.m_value;
          local_13c8 = local_13d8;
          local_13c0 = local_13d0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_13b8,&local_13c8);
          std::operator+(&local_1370,&local_1390,&local_13b8);
          std::operator+(&local_1350,&local_1370,": ");
          std::operator+(&local_1330,&local_1350,"objectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1330);
          std::__cxx11::string::~string((string *)&local_1330);
          std::__cxx11::string::~string((string *)&local_1350);
          std::__cxx11::string::~string((string *)&local_1370);
          std::__cxx11::string::~string((string *)&local_13b8);
          std::__cxx11::string::~string((string *)&local_1390);
          std::allocator<char>::~allocator(&local_1391);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1558,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1558,(char (*) [22])"Querying label length");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1558);
      sync._4_4_ = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))(uStack_b8,0,(long)&sync + 4,0);
      do {
        local_155c = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_155c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15e0,"Got Error ",&local_15e1);
          EVar7 = glu::getErrorStr(local_155c);
          local_1628 = EVar7.m_getName;
          local_1620 = EVar7.m_value;
          local_1618 = local_1628;
          local_1610 = local_1620;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1608,&local_1618);
          std::operator+(&local_15c0,&local_15e0,&local_1608);
          std::operator+(&local_15a0,&local_15c0,": ");
          std::operator+(&local_1580,&local_15a0,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1580);
          std::__cxx11::string::~string((string *)&local_1580);
          std::__cxx11::string::~string((string *)&local_15a0);
          std::__cxx11::string::~string((string *)&local_15c0);
          std::__cxx11::string::~string((string *)&local_1608);
          std::__cxx11::string::~string((string *)&local_15e0);
          std::allocator<char>::~allocator(&local_15e1);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (sync._4_4_ == 0x15) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_17e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_17e8,(char (*) [24])"Query returned length: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&sync + 4));
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_17e8);
      }
      else {
        de::toString<int>(&local_1668,(int *)((long)&sync + 4));
        std::operator+(&local_1648,"\'length\' was not 21, got ",&local_1668);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1648);
        std::__cxx11::string::~string((string *)&local_1648);
        std::__cxx11::string::~string((string *)&local_1668);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_d28);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(sync._0_4_);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(uStack_b8);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x9d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

LabelLengthCase::IterateResult LabelLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}